

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O1

Vec3 random_in_unit_disk_2(void)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  undefined8 *in_RDI;
  Vec3 VVar4;
  
  do {
    dVar2 = drand48();
    dVar3 = drand48();
    VVar4.e[0] = (float)dVar2 + (float)dVar2 + -1.0;
    VVar4.e[1] = (float)dVar3 + (float)dVar3 + -1.0;
  } while (1.0 <= VVar4.e[0] * VVar4.e[0] + VVar4.e[1] * VVar4.e[1]);
  *(undefined4 *)(in_RDI + 1) = 0;
  uVar1 = CONCAT44(VVar4.e[1],VVar4.e[0]);
  *in_RDI = uVar1;
  VVar4.e[2] = VVar4.e[1] * VVar4.e[1];
  return (Vec3)VVar4.e;
}

Assistant:

Vec3
random_in_unit_disk_2(void)
{
    Vec3 _point;
    do {
        _point = 2.0f * Vec3(RANDOM_GEN(), RANDOM_GEN(), 0.0f) - Vec3(1.0f, 1.0f, 0.0f);

    } while (dot(_point,_point) >= 1.0f);

    return _point;
}